

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

InterpretResult run(Vm *vm)

{
  CallFrame ***pppCVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  ObjectType OVar5;
  uint32_t index;
  CallFrame *pCVar6;
  uint8_t *puVar7;
  CrispyValue *pCVar8;
  ObjList *pOVar9;
  Object *pOVar10;
  object_t *poVar11;
  size_t __n;
  CallFrame **ppCVar12;
  long lVar13;
  HashTable content;
  FrameArray *frame_arr;
  _Bool _Var14;
  int iVar15;
  InterpretResult IVar16;
  undefined4 uVar17;
  ulong uVar18;
  undefined8 extraout_RAX;
  byte bVar23;
  ObjDict *object;
  undefined8 extraout_RAX_00;
  undefined8 uVar19;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar20;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 *extraout_RAX_01;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 *paVar21;
  ObjString *list;
  CallFrame *pCVar22;
  bool value_00;
  int iVar24;
  uint uVar25;
  CrispyValue *pCVar26;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 in_RDX;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_00;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_01;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_02;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_03;
  long lVar27;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_05;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_06;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_08;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_09;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_10;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_11;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_12;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_13;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_14;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_15;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_16;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_17;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_18;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_19;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_20;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_21;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_22;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_23;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_24;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_25;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_26;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_27;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_28;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_29;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_30;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_31;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_32;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_33;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_34;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 *paVar28;
  long lVar29;
  byte *pbVar30;
  byte *pbVar31;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 *paVar32;
  bool bVar33;
  double dVar34;
  double dVar35;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar36;
  HTItemKey key;
  HTItemKey key_00;
  CrispyValue value_01;
  HTItemKey key_01;
  CrispyValue value_02;
  undefined1 auVar37 [16];
  CrispyValue CVar38;
  CrispyValue value_03;
  CrispyValue second;
  CrispyValue second_00;
  CrispyValue second_01;
  CrispyValue second_02;
  CrispyValue second_03;
  CrispyValue second_04;
  CrispyValue value_04;
  CrispyValue value_05;
  CrispyValue first;
  CrispyValue first_00;
  CrispyValue first_01;
  CrispyValue first_02;
  CrispyValue value_06;
  CrispyValue first_03;
  CrispyValue first_04;
  CrispyValue value_07;
  ValueArray *apVStack_b8 [2];
  FrameArray *local_a8;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aStack_a0;
  CrispyValue value;
  HTItem **ppHStack_88;
  InterpretResult local_4c;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_04;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_07;
  
  local_a8 = &vm->frames;
  pppCVar1 = &(vm->frames).frame_pointers;
  paVar32 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)vm->sp;
  pCVar6 = (vm->frames).frame_pointers[vm->frame_count - 1];
  puVar7 = (pCVar6->code_buffer).code;
  pCVar8 = (pCVar6->constants).values;
  apVStack_b8[1] = &pCVar6->variables;
  pbVar30 = pCVar6->ip;
  do {
    if ((long)paVar32 - (long)vm < 0) {
      puts("Negative stack pointer");
      iVar15 = 4;
      in_RDX = extraout_RDX;
      pbVar31 = pbVar30;
      goto LAB_00103f59;
    }
    pbVar31 = pbVar30 + 1;
    bVar23 = *pbVar30;
    if (0x31 < (ulong)bVar23) {
      printf("Unknown instruction %d\n");
      iVar15 = 1;
      local_4c = INTERPRET_RUNTIME_ERROR;
      in_RDX = extraout_RDX_06;
      goto LAB_00103f59;
    }
    CVar38.field_1.p_value = in_RDX.p_value;
    CVar38._0_8_ = (long)&switchD_00103724::switchdataD_00109598 +
                   (long)(int)(&switchD_00103724::switchdataD_00109598)[bVar23];
    paVar28 = paVar32;
    switch(bVar23) {
    default:
      _Var14 = false;
      goto LAB_00103b94;
    case 1:
      _Var14 = true;
LAB_00103b94:
      CVar38 = create_bool(_Var14);
LAB_00103e91:
      *(ValueType *)paVar32 = CVar38.type;
      paVar32[1].p_value = (uint64_t)CVar38.field_1;
LAB_00103e99:
      paVar28 = paVar32 + 2;
      break;
    case 3:
      CVar38 = create_nil();
      goto LAB_00103e91;
    case 4:
      uVar25 = *(uint *)(paVar32 + -2);
      aVar20 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)paVar32[-1].o_value;
      pOVar9 = (ObjList *)paVar32[-3].o_value;
      in_RDX._0_4_ = *(uint *)(paVar32 + -4) ^ 1;
      in_RDX.p_value._4_4_ = 0;
      aStack_a0 = aVar20;
      if (uVar25 == 1 && in_RDX._0_4_ == 0) {
        *(undefined4 *)(paVar32 + -4) = 1;
        *(undefined4 *)((long)paVar32 + -0x1c) = *(undefined4 *)((long)paVar32 + -0x1c);
        paVar32[-3].d_value = aVar20.d_value + (double)pOVar9;
        uVar19 = 5;
        bVar33 = true;
        paVar28 = paVar32 + -2;
      }
      else {
        paVar28 = paVar32 + -4;
        if (*(uint *)(paVar32 + -4) == 2) {
          (pOVar9->object).marked = '\x01';
          OVar5 = (pOVar9->object).type;
          if (OVar5 == OBJ_LIST) {
            list = (ObjString *)clone_list(vm,pOVar9);
            value_02._4_4_ = 0;
            value_02.type = uVar25;
            value_02.field_1.o_value = (Object *)aVar20.p_value;
            list_append((ObjList *)list,value_02);
LAB_0010438c:
            CVar38 = create_object(&list->object);
            in_RDX = CVar38.field_1;
            *(ValueType *)(paVar32 + -4) = CVar38.type;
            paVar32[-3].p_value = (uint64_t)in_RDX;
            uVar19 = 5;
            bVar33 = true;
            paVar28 = paVar32 + -2;
          }
          else {
            if (OVar5 == OBJ_STRING) {
              if ((uVar25 == 2) && ((aVar20.o_value)->type == OBJ_STRING)) {
                (aVar20.o_value)->marked = '\x01';
                list = new_empty_string(vm,*(long *)(aVar20.p_value + 0x10) + (pOVar9->content).cap)
                ;
                memcpy(list->start,(void *)(pOVar9->content).count,(pOVar9->content).cap);
                pOVar10 = (Object *)(aVar20.p_value + 0x10);
                __n._0_1_ = pOVar10->marked;
                __n._1_3_ = *(undefined3 *)&pOVar10->field_0x1;
                __n._4_4_ = pOVar10->type;
                memcpy(list->start + (pOVar9->content).cap,*(object_t **)(aVar20.p_value + 0x18),__n
                      );
                goto LAB_0010438c;
              }
              run_cold_21();
              in_RDX = extraout_RDX_28;
            }
            else {
              run_cold_22();
              in_RDX = extraout_RDX_34;
            }
            uVar19 = 4;
            bVar33 = false;
          }
        }
        else {
          run_cold_20();
          uVar19 = 4;
          bVar33 = false;
          in_RDX = extraout_RDX_18;
        }
      }
      iVar15 = (int)uVar19;
      CVar38.field_1.p_value = in_RDX.p_value;
      CVar38._0_8_ = uVar19;
      paVar32 = paVar28;
      if (bVar33) break;
      goto LAB_00103f59;
    case 5:
      bVar33 = *(int *)(paVar32 + -2) == 1 && *(int *)(paVar32 + -4) == 1;
      if (*(int *)(paVar32 + -2) != 1 || *(int *)(paVar32 + -4) != 1) {
LAB_00103d4a:
        paVar28 = paVar32 + -4;
        goto LAB_00103d4e;
      }
      dVar35 = paVar32[-3].d_value - paVar32[-1].d_value;
      goto LAB_00103d3c;
    case 6:
      bVar33 = *(int *)(paVar32 + -2) == 1 && *(int *)(paVar32 + -4) == 1;
      if (*(int *)(paVar32 + -2) != 1 || *(int *)(paVar32 + -4) != 1) goto LAB_00103d4a;
      dVar35 = paVar32[-3].d_value * paVar32[-1].d_value;
LAB_00103d3c:
      paVar32[-3].d_value = dVar35;
      paVar28 = paVar32 + -2;
      uVar19 = 0;
LAB_00103d53:
      iVar15 = (int)uVar19;
      CVar38._0_8_ = uVar19;
      paVar32 = paVar28;
      if (bVar33) break;
      goto LAB_00103f59;
    case 7:
      bVar33 = *(int *)(paVar32 + -2) == 1 && *(int *)(paVar32 + -4) == 1;
      if (*(int *)(paVar32 + -2) != 1 || *(int *)(paVar32 + -4) != 1) goto LAB_00103d4a;
      dVar35 = paVar32[-1].d_value;
      if ((dVar35 == 0.0) && (!NAN(dVar35))) {
        run_cold_18();
      }
      *(undefined4 *)(paVar32 + -4) = 1;
      paVar32[-3].d_value = paVar32[-3].d_value / dVar35;
      paVar28 = paVar32 + -2;
LAB_00103d4e:
      uVar19 = 4;
      goto LAB_00103d53;
    case 8:
      bVar33 = *(int *)(paVar32 + -2) == 1 && *(int *)(paVar32 + -4) == 1;
      if (*(int *)(paVar32 + -2) == 1 && *(int *)(paVar32 + -4) == 1) {
        dVar35 = (double)((long)paVar32[-3].d_value % (long)paVar32[-1].d_value);
LAB_00103de5:
        CVar38 = create_number(dVar35);
LAB_00103dea:
        paVar28 = paVar32 + -2;
        in_RDX = CVar38.field_1;
        *(ValueType *)(paVar32 + -4) = CVar38.type;
        paVar32[-3].p_value = (uint64_t)in_RDX;
      }
      else {
        paVar28 = paVar32 + -4;
        run_cold_19();
        in_RDX = extraout_RDX_15;
      }
      goto LAB_00103df5;
    case 9:
      bVar33 = *(int *)(paVar32 + -2) == 1 && *(int *)(paVar32 + -4) == 1;
      if (*(int *)(paVar32 + -2) == 1 && *(int *)(paVar32 + -4) == 1) {
        dVar35 = pow(paVar32[-3].d_value,paVar32[-1].d_value);
        goto LAB_00103de5;
      }
      goto LAB_00103da8;
    case 10:
      bVar33 = *(int *)(paVar32 + -2) == 3 && *(int *)(paVar32 + -4) == 3;
      if (*(int *)(paVar32 + -2) == 3 && *(int *)(paVar32 + -4) == 3) {
        value_00 = (double)paVar32[-1].p_value != 0.0 && (double)paVar32[-3].p_value != 0.0;
LAB_00103da1:
        CVar38 = create_bool(value_00);
        goto LAB_00103dea;
      }
      goto LAB_00103da8;
    case 0xb:
      bVar33 = *(int *)(paVar32 + -2) == 3 && *(int *)(paVar32 + -4) == 3;
      if (*(int *)(paVar32 + -2) == 3 && *(int *)(paVar32 + -4) == 3) {
        value_00 = (double)paVar32[-1].p_value != 0.0 || (double)paVar32[-3].p_value != 0.0;
        goto LAB_00103da1;
      }
LAB_00103da8:
      paVar28 = paVar32 + -4;
LAB_00103df5:
      iVar15 = 4;
      CVar38.field_1.p_value = in_RDX.p_value;
      CVar38._0_8_ = 4;
      paVar32 = paVar28;
      if (bVar33) break;
      goto LAB_00103f59;
    case 0xc:
      second_01._4_4_ = 0;
      second_01.type = *(uint *)(paVar32 + -2);
      first_01._4_4_ = 0;
      first_01.type = *(uint *)(paVar32 + -4);
      second_01.field_1.p_value = paVar32[-1].p_value;
      first_01.field_1.p_value = paVar32[-3].p_value;
      iVar15 = cmp_values(first_01,second_01);
      bVar33 = iVar15 == 0;
      goto LAB_00103d02;
    case 0xd:
      second_04._4_4_ = 0;
      second_04.type = *(uint *)(paVar32 + -2);
      first_04._4_4_ = 0;
      first_04.type = *(uint *)(paVar32 + -4);
      second_04.field_1.p_value = paVar32[-1].p_value;
      first_04.field_1.p_value = paVar32[-3].p_value;
      iVar15 = cmp_values(first_04,second_04);
      bVar33 = iVar15 != 0;
      goto LAB_00103d02;
    case 0xe:
      second_00._4_4_ = 0;
      second_00.type = *(uint *)(paVar32 + -2);
      first_00._4_4_ = 0;
      first_00.type = *(uint *)(paVar32 + -4);
      second_00.field_1.p_value = paVar32[-1].p_value;
      first_00.field_1.p_value = paVar32[-3].p_value;
      iVar15 = cmp_values(first_00,second_00);
      bVar33 = 0 < iVar15;
      goto LAB_00103d02;
    case 0xf:
      second_02._4_4_ = 0;
      second_02.type = *(uint *)(paVar32 + -2);
      first_02._4_4_ = 0;
      first_02.type = *(uint *)(paVar32 + -4);
      second_02.field_1.p_value = paVar32[-1].p_value;
      first_02.field_1.p_value = paVar32[-3].p_value;
      iVar15 = cmp_values(first_02,second_02);
      bVar23 = (byte)((uint)iVar15 >> 0x18);
      goto LAB_00103bb7;
    case 0x10:
      second._4_4_ = 0;
      second.type = *(uint *)(paVar32 + -2);
      first._4_4_ = 0;
      first.type = *(uint *)(paVar32 + -4);
      second.field_1.p_value = paVar32[-1].p_value;
      first.field_1.p_value = paVar32[-3].p_value;
      iVar15 = cmp_values(first,second);
      bVar23 = ~(byte)((uint)iVar15 >> 0x18);
LAB_00103bb7:
      bVar33 = (bool)(bVar23 >> 7);
      goto LAB_00103d02;
    case 0x11:
      second_03._4_4_ = 0;
      second_03.type = *(uint *)(paVar32 + -2);
      first_03._4_4_ = 0;
      first_03.type = *(uint *)(paVar32 + -4);
      second_03.field_1.p_value = paVar32[-1].p_value;
      first_03.field_1.p_value = paVar32[-3].p_value;
      iVar15 = cmp_values(first_03,second_03);
      bVar33 = iVar15 < 1;
LAB_00103d02:
      paVar28 = paVar32 + -2;
      CVar38 = create_bool(bVar33);
      *(ValueType *)(paVar32 + -4) = CVar38.type;
      paVar32[-3].p_value = (uint64_t)CVar38.field_1;
      break;
    case 0x12:
      uVar25 = (uint)pbVar30[1];
      pbVar31 = pbVar30 + 2;
      goto LAB_00103f08;
    case 0x13:
      pbVar31 = pbVar30 + 3;
      uVar25 = (uint)(ushort)(*(ushort *)(pbVar30 + 1) << 8 | *(ushort *)(pbVar30 + 1) >> 8);
LAB_00103f08:
      paVar21 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(ulong)(uVar25 << 4);
      paVar28 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)((long)&pCVar8->type + (long)paVar21);
      aVar20 = *paVar28;
      aVar36 = paVar28[1];
LAB_00103f47:
      *paVar32 = aVar20;
      paVar32[1] = aVar36;
      paVar28 = paVar32 + 2;
      goto LAB_00103f51;
    case 0x14:
      dVar35 = 0.0;
      goto LAB_00103cd7;
    case 0x15:
      dVar35 = 1.0;
LAB_00103cd7:
      CVar38 = create_number(dVar35);
      goto LAB_00103e91;
    case 0x16:
      pbVar31 = pbVar30 + 2;
      paVar28 = paVar32 + -2;
      value_04._4_4_ = 0;
      value_04.type = *(uint *)(paVar32 + -2);
      value_04.field_1.p_value = paVar32[-1].p_value;
      write_at(apVStack_b8[1],(ulong)pbVar30[1],value_04);
      paVar21 = extraout_RAX_01;
      in_RDX = extraout_RDX_04;
      goto LAB_00103f51;
    case 0x17:
      paVar21 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(pCVar6->variables).values;
      bVar23 = pbVar30[1];
      pbVar31 = pbVar30 + 2;
      goto LAB_00103f3f;
    case 0x18:
      bVar23 = pbVar30[2];
      pbVar31 = pbVar30 + 3;
      in_RDX.p_value = (uint64_t)*pppCVar1;
      paVar21 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)
                (((CallFrame **)(in_RDX.p_value - 8))[pbVar30[1]]->variables).values;
LAB_00103f3f:
      aVar20 = paVar21[(ulong)bVar23 * 2];
      aVar36 = (paVar21 + (ulong)bVar23 * 2)[1];
      goto LAB_00103f47;
    case 0x19:
      bVar23 = pbVar30[2];
      pbVar31 = pbVar30 + 3;
      in_RDX.p_value = (uint64_t)*pppCVar1;
      paVar21 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)
                (((CallFrame **)(in_RDX.p_value - 8))[pbVar30[1]]->variables).values;
      aVar20 = paVar32[-1];
      paVar28 = paVar32 + -2;
      paVar21[(ulong)bVar23 * 2] = paVar32[-2];
      (paVar21 + (ulong)bVar23 * 2)[1] = aVar20;
      goto LAB_00103f51;
    case 0x1a:
      *paVar32 = paVar32[-2];
      paVar32[1] = paVar32[-1];
      goto LAB_00103e99;
    case 0x1b:
      paVar28 = paVar32 + -2;
      break;
    case 0x1c:
      bVar23 = pbVar30[1];
      uVar18 = (ulong)bVar23;
      if (*(int *)(paVar32 + uVar18 * -2 + -2) == 2) {
        pOVar10 = paVar32[uVar18 * -2 + -1].o_value;
        pOVar10->marked = '\x01';
        if (pOVar10->type == OBJ_LAMBDA) {
          bVar4 = pOVar10[1].marked;
          if (bVar4 != bVar23) {
LAB_00104419:
            fprintf(_stderr,"Invalid number of arguments. Expected %d, but got %d\n",(ulong)bVar4,
                    (ulong)(uint)bVar23);
            in_RDX = extraout_RDX_17;
            goto LAB_00104475;
          }
          lVar13 = (ulong)bVar23 * -0x10;
          if (bVar23 != 0) {
            lVar29 = -0x10;
            lVar27 = 0;
            do {
              uVar19 = ((undefined8 *)((long)paVar32 + lVar29))[1];
              puVar2 = (undefined8 *)((long)apVStack_b8 + lVar27 + lVar13 + -0xb8 + 0xb8);
              *puVar2 = *(undefined8 *)((long)paVar32 + lVar29);
              puVar2[1] = uVar19;
              lVar27 = lVar27 + 0x10;
              lVar29 = lVar29 + -0x10;
            } while ((ulong)bVar23 * 0x10 != lVar27);
            paVar32 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)((long)paVar32 - lVar27);
          }
          pCVar22 = (CallFrame *)pOVar10[1].next;
          *(undefined8 *)(&stack0xffffffffffffff40 + lVar13) = 0x1042ba;
          pCVar22 = new_temp_call_frame(pCVar22);
          frame_arr = local_a8;
          index = vm->frame_count;
          vm->frame_count = index + 1;
          *(undefined8 *)(&stack0xffffffffffffff40 + lVar13) = 0x1042d4;
          frames_write_at(frame_arr,index,pCVar22);
          paVar28 = paVar32;
          if (bVar23 != 0) {
            lVar27 = 0;
            do {
              puVar2 = (undefined8 *)((long)apVStack_b8 + lVar27 + lVar13 + -0xb8 + 0xb8);
              uVar19 = puVar2[1];
              *(undefined8 *)((long)paVar32 + lVar27) = *puVar2;
              ((undefined8 *)((long)paVar32 + lVar27))[1] = uVar19;
              lVar27 = lVar27 + 0x10;
            } while ((ulong)bVar23 * 0x10 != lVar27);
            paVar28 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(lVar27 + (long)paVar32);
          }
          vm->sp = (CrispyValue *)paVar28;
          *(undefined8 *)(&stack0xffffffffffffff40 + lVar13) = 0x10430e;
          IVar16 = run(vm);
          ppCVar12 = (vm->frames).frame_pointers;
          uVar25 = vm->frame_count - 1;
          vm->frame_count = uVar25;
          pCVar22 = ppCVar12[uVar25];
          *(undefined8 *)(&stack0xffffffffffffff40 + lVar13) = 0x104331;
          temp_call_frame_free(pCVar22);
          uVar18 = (ulong)((uint)(IVar16 == INTERPRET_OK) * 4 + 1);
          in_RDX = extraout_RDX_09;
          if (IVar16 != INTERPRET_OK) {
            paVar32 = paVar28;
            local_4c = IVar16;
          }
        }
        else {
          if (pOVar10->type != OBJ_NATIVE_FUNC) {
            run_cold_24();
            in_RDX = extraout_RDX_22;
            goto LAB_00104475;
          }
          bVar4 = pOVar10[1].field_0x1;
          if (bVar4 != bVar23) goto LAB_00104419;
          lVar13 = (ulong)bVar23 * -0x10;
          if (bVar23 != 0) {
            lVar27 = 0;
            do {
              puVar2 = (undefined8 *)((long)paVar32 + lVar27 + uVar18 * -0x10);
              uVar19 = puVar2[1];
              puVar3 = (undefined8 *)((long)(apVStack_b8 + (ulong)bVar23 * -2) + lVar27);
              *puVar3 = *puVar2;
              puVar3[1] = uVar19;
              lVar27 = lVar27 + 0x10;
            } while (uVar18 * 0x10 != lVar27);
            paVar32 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)((long)paVar32 - lVar27);
          }
          if (pOVar10[1].marked == '\0') {
            poVar11 = pOVar10[1].next;
            *(undefined8 *)(&stack0xffffffffffffff40 + lVar13) = 0x1043b7;
            uVar17 = (*(code *)poVar11)();
            in_RDX = extraout_RDX_10;
          }
          else {
            vm->sp = (CrispyValue *)paVar32;
            vm->current_status = VM_STATUS_NO_GC;
            poVar11 = pOVar10[1].next;
            *(undefined8 *)(&stack0xffffffffffffff40 + lVar13) = 0x10400b;
            auVar37 = (*(code *)poVar11)(apVStack_b8 + (ulong)bVar23 * -2,vm);
            in_RDX.p_value = auVar37._8_8_;
            uVar17 = auVar37._0_4_;
            vm->current_status = VM_STATUS_RUNNING;
            if (vm->err_flag == true) {
              vm->err_flag = false;
              value_07._0_8_ = auVar37._0_8_ & 0xffffffff;
              *(undefined8 *)(&stack0xffffffffffffff40 + lVar13) = 0x10403a;
              value_07.field_1.p_value = in_RDX.p_value;
              print_value(value_07,true,false);
              uVar18 = 4;
              in_RDX = extraout_RDX_05;
              goto LAB_0010447a;
            }
          }
          *(undefined4 *)(paVar32 + -2) = uVar17;
          paVar32[-1].p_value = (uint64_t)in_RDX;
          uVar18 = 5;
        }
      }
      else {
        run_cold_23();
        in_RDX = extraout_RDX_16;
LAB_00104475:
        uVar18 = 4;
      }
LAB_0010447a:
      pbVar31 = pbVar30 + 2;
      paVar28 = paVar32;
      goto LAB_00104484;
    case 0x1d:
      CVar38 = create_number(-(double)paVar32[-1].p_value);
      *(ValueType *)(paVar32 + -2) = CVar38.type;
      paVar32[-1].p_value = (uint64_t)CVar38.field_1;
      break;
    case 0x1e:
      iVar24 = *(int *)(paVar32 + -2);
      if (iVar24 != 3) goto LAB_00103e28;
      aVar20.p_value._1_7_ = 0;
      aVar20.p_value._0_1_ = (double)paVar32[-1].p_value == 0.0;
      paVar32[-1] = aVar20;
      goto LAB_00103e2c;
    case 0x1f:
      uVar25 = *(uint *)(paVar32 + -2);
      aVar20 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)paVar32[-1].p_value;
      printf("> ");
      value_06._4_4_ = 0;
      value_06.type = uVar25;
      value_06.field_1 =
           (anon_union_8_3_4e733eb7_for_CrispyValue_1)
           (anon_union_8_3_4e733eb7_for_CrispyValue_1)aVar20.p_value;
      print_value(value_06,true,true);
      uVar19 = extraout_RAX_00;
      aVar20 = extraout_RDX_03;
LAB_00103c50:
      CVar38.field_1.d_value = aVar20.d_value;
      CVar38._0_8_ = uVar19;
      paVar28 = paVar32 + -2;
      break;
    case 0x20:
      ht_init((HashTable *)&aStack_a0,HT_KEY_OBJSTRING,8,free_objstring);
      content.size = value.type;
      content._12_4_ = value._4_4_;
      content.key_type = aStack_a0.p_value._0_4_;
      content.cap = aStack_a0.p_value._4_4_;
      content.free_callback = (_func_void_HTItem_ptr *)value.field_1.p_value;
      content.buckets = ppHStack_88;
      object = new_dict(vm,content);
      goto LAB_00103e89;
    case 0x21:
      object = (ObjDict *)new_list(vm,0);
LAB_00103e89:
      CVar38 = create_object(&object->object);
      goto LAB_00103e91;
    case 0x22:
      if ((*(int *)(paVar32 + -4) == 2) &&
         ((((ObjList *)paVar32[-3].o_value)->object).type == OBJ_LIST)) {
        value_01._4_4_ = 0;
        value_01.type = *(uint *)(paVar32 + -2);
        value_01.field_1.p_value = paVar32[-1].p_value;
        list_append((ObjList *)paVar32[-3].o_value,value_01);
        uVar19 = extraout_RAX;
        aVar20 = extraout_RDX_02;
        goto LAB_00103c50;
      }
      run_cold_17();
      iVar15 = 4;
      in_RDX = extraout_RDX_11;
      paVar32 = paVar32 + -2;
      goto LAB_00103f59;
    case 0x23:
      uVar25 = *(uint *)(paVar32 + -2);
      aVar36 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)paVar32[-1].p_value;
      iVar15 = *(int *)(paVar32 + -4);
      aVar20 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)paVar32[-3].d_value;
      aStack_a0 = aVar20;
      if (*(int *)(paVar32 + -6) == 2) {
        pOVar9 = (ObjList *)paVar32[-5].o_value;
        OVar5 = (pOVar9->object).type;
        if (OVar5 == OBJ_LIST) {
          dVar35 = floor(aVar20.d_value);
          if (((iVar15 != 1) || (dVar35 != aVar20.d_value)) || (NAN(dVar35) || NAN(aVar20.d_value)))
          {
            run_cold_13();
            in_RDX = extraout_RDX_26;
            goto LAB_001044f2;
          }
          value_05._4_4_ = 0;
          value_05.type = uVar25;
          value_05.field_1.p_value = aVar36.p_value;
          _Var14 = list_add(pOVar9,(long)aVar20.d_value,value_05);
          in_RDX = extraout_RDX_07;
          if (!_Var14) {
            run_cold_12();
            in_RDX = extraout_RDX_32;
            goto LAB_001044f2;
          }
LAB_001041d0:
          uVar18 = 0x20;
          bVar33 = true;
        }
        else {
          if (OVar5 != OBJ_DICT) {
            run_cold_16();
            in_RDX = extraout_RDX_20;
            goto LAB_0010445b;
          }
          if (iVar15 == 2) {
            if ((aVar20.o_value)->type == OBJ_STRING) {
              value_03._4_4_ = 0;
              value_03.type = uVar25;
              key.field_0.ident_length = in_RDX.p_value;
              key._0_8_ = aVar20.p_value;
              value_03.field_1.p_value = aVar36.p_value;
              ht_put((HashTable *)&pOVar9->content,key,value_03);
              in_RDX = extraout_RDX_01;
              goto LAB_001041d0;
            }
            run_cold_15();
            in_RDX = extraout_RDX_30;
          }
          else {
            run_cold_14();
            in_RDX = extraout_RDX_23;
          }
LAB_001044f2:
          uVar18 = 4;
          bVar33 = false;
        }
        if (bVar33) {
          uVar18 = 5;
        }
      }
      else {
        run_cold_11();
        in_RDX = extraout_RDX_13;
LAB_0010445b:
        uVar18 = 4;
      }
      paVar28 = paVar32 + -4;
      goto LAB_00104484;
    case 0x24:
      iVar15 = *(int *)(paVar32 + -2);
      dVar35 = paVar32[-1].d_value;
      paVar28 = paVar32 + -4;
      if (*(int *)(paVar32 + -4) == 2) {
        pOVar9 = (ObjList *)paVar32[-3].o_value;
        OVar5 = (pOVar9->object).type;
        if (OVar5 == OBJ_LIST) {
          dVar34 = floor(dVar35);
          if (((iVar15 != 1) || (dVar34 != dVar35)) || (NAN(dVar34) || NAN(dVar35))) {
            run_cold_7();
            in_RDX = extraout_RDX_27;
LAB_00104503:
            uVar18 = 4;
          }
          else {
            _Var14 = list_get(pOVar9,(long)dVar35,(CrispyValue *)&aStack_a0);
            if (!_Var14) {
              run_cold_6();
              in_RDX = extraout_RDX_33;
              goto LAB_00104503;
            }
            *paVar28 = aStack_a0;
            paVar32[-3] = (anon_union_8_3_4e733eb7_for_CrispyValue_1)value._0_8_;
            uVar18 = 0x21;
            in_RDX = extraout_RDX_08;
            paVar28 = paVar32 + -2;
          }
          if ((int)uVar18 == 0x21) {
LAB_00104253:
            uVar18 = 5;
          }
        }
        else {
          if (OVar5 == OBJ_DICT) {
            if (iVar15 == 2) {
              if (*(int *)((long)dVar35 + 4) != 0) {
                run_cold_9();
                uVar18 = 4;
                in_RDX = extraout_RDX_31;
                goto LAB_00104484;
              }
              key_00.field_0.ident_length = in_RDX.p_value;
              key_00._0_8_ = dVar35;
              CVar38 = ht_get((HashTable *)&pOVar9->content,key_00);
              in_RDX = CVar38.field_1;
              *(ValueType *)(paVar32 + -4) = CVar38.type;
              paVar32[-3].p_value = (uint64_t)in_RDX;
              paVar28 = paVar32 + -2;
              goto LAB_00104253;
            }
            run_cold_8();
            in_RDX = extraout_RDX_24;
          }
          else {
            run_cold_10();
            in_RDX = extraout_RDX_21;
          }
          uVar18 = 4;
        }
      }
      else {
        run_cold_5();
        uVar18 = 4;
        in_RDX = extraout_RDX_14;
      }
      goto LAB_00104484;
    case 0x25:
      iVar15 = *(int *)(paVar32 + -2);
      dVar35 = paVar32[-1].d_value;
      if (*(int *)(paVar32 + -4) == 2) {
        pOVar9 = (ObjList *)paVar32[-3].o_value;
        OVar5 = (pOVar9->object).type;
        if (OVar5 == OBJ_DICT) {
          key_01.field_0.ident_length = in_RDX.p_value;
          key_01._0_8_ = dVar35;
          CVar38 = ht_get((HashTable *)&pOVar9->content,key_01);
          in_RDX = CVar38.field_1;
          *(ValueType *)paVar32 = CVar38.type;
          paVar32[1].p_value = (uint64_t)in_RDX;
          paVar28 = paVar32 + 2;
          uVar18 = 5;
        }
        else if (OVar5 == OBJ_LIST) {
          dVar34 = floor(dVar35);
          if (((iVar15 != 1) || (dVar34 != dVar35)) || (NAN(dVar34) || NAN(dVar35))) {
            run_cold_3();
            in_RDX = extraout_RDX_25;
LAB_001044cd:
            uVar25 = 4;
          }
          else {
            _Var14 = list_get(pOVar9,(long)dVar35 & 0xffffffff,(CrispyValue *)&aStack_a0);
            if (!_Var14) {
              run_cold_2();
              in_RDX = extraout_RDX_29;
              goto LAB_001044cd;
            }
            *paVar32 = aStack_a0;
            paVar32[1] = (anon_union_8_3_4e733eb7_for_CrispyValue_1)value._0_8_;
            paVar32 = paVar32 + 2;
            uVar25 = 0x22;
            in_RDX = extraout_RDX_00;
          }
          uVar18 = 5;
          paVar28 = paVar32;
          if (uVar25 != 0x22) {
            uVar18 = (ulong)uVar25;
          }
        }
        else {
          run_cold_4();
          uVar18 = 4;
          in_RDX = extraout_RDX_19;
        }
      }
      else {
        run_cold_1();
        uVar18 = 4;
        in_RDX = extraout_RDX_12;
      }
LAB_00104484:
      CVar38.field_1.p_value = in_RDX.p_value;
      CVar38._0_8_ = uVar18;
      iVar15 = (int)uVar18;
      paVar32 = paVar28;
      if (iVar15 == 5) break;
      goto LAB_00103f59;
    case 0x26:
      auVar37._8_8_ = 0;
      auVar37._0_8_ = in_RDX.p_value;
      CVar38 = (CrispyValue)(auVar37 << 0x40);
      pbVar31 = puVar7 + (ushort)(*(ushort *)(pbVar30 + 1) << 8 | *(ushort *)(pbVar30 + 1) >> 8);
      break;
    case 0x27:
      if (paVar32[-3].p_value == paVar32[-1].p_value) goto LAB_0010374a;
LAB_0010398f:
      paVar21 = paVar32 + -4;
      pbVar31 = pbVar30 + 3;
      paVar28 = paVar21;
      goto LAB_00103f51;
    case 0x28:
      iVar24 = *(int *)(paVar32 + -2);
      if (iVar24 == 3) {
        if ((double)paVar32[-1].p_value != 4.94065645841247e-324) goto LAB_00103c96;
LAB_00103ac3:
        pbVar31 = puVar7 + (ushort)(*(ushort *)(pbVar30 + 1) << 8 | *(ushort *)(pbVar30 + 1) >> 8);
      }
      goto LAB_00103e28;
    case 0x29:
      iVar24 = *(int *)(paVar32 + -2);
      if (iVar24 == 3) {
        if ((double)paVar32[-1].p_value != 4.94065645841247e-324) goto LAB_00103ac3;
LAB_00103c96:
        pbVar31 = pbVar30 + 3;
      }
LAB_00103e28:
      paVar32 = paVar32 + -2;
LAB_00103e2c:
      iVar15 = 4;
      CVar38._0_8_ = 4;
      paVar28 = paVar32;
      if (iVar24 == 3) break;
      goto LAB_00103f59;
    case 0x2a:
      if (paVar32[-3].p_value == paVar32[-1].p_value) goto LAB_0010398f;
      goto LAB_0010374a;
    case 0x2b:
      if (paVar32[-1].p_value <= paVar32[-3].p_value) goto LAB_0010398f;
      goto LAB_0010374a;
    case 0x2c:
      if (paVar32[-1].p_value < paVar32[-3].p_value) goto LAB_0010398f;
      goto LAB_0010374a;
    case 0x2d:
      if (paVar32[-3].p_value <= paVar32[-1].p_value) goto LAB_0010398f;
      goto LAB_0010374a;
    case 0x2e:
      if (paVar32[-3].p_value < paVar32[-1].p_value) goto LAB_0010398f;
LAB_0010374a:
      CVar38._0_8_ = paVar32 + -4;
      pbVar31 = puVar7 + (ushort)(*(ushort *)(pbVar30 + 1) << 8 | *(ushort *)(pbVar30 + 1) >> 8);
      paVar28 = paVar32 + -4;
      break;
    case 0x2f:
      pCVar26 = (pCVar6->variables).values;
      uVar18 = (ulong)pbVar30[1];
      dVar35 = pCVar26[uVar18].field_1.d_value + 1.0;
      goto LAB_001039f3;
    case 0x30:
      pCVar26 = (pCVar6->variables).values;
      uVar18 = (ulong)pbVar30[1];
      dVar35 = pCVar26[uVar18].field_1.d_value + -1.0;
LAB_001039f3:
      paVar21 = (anon_union_8_3_4e733eb7_for_CrispyValue_1 *)0x0;
      pbVar31 = pbVar30 + 2;
      pCVar26[uVar18].field_1.d_value = dVar35;
LAB_00103f51:
      CVar38.field_1.p_value = in_RDX.p_value;
      CVar38._0_8_ = paVar21;
      break;
    case 0x31:
      local_4c = INTERPRET_OK;
      iVar15 = 1;
      goto LAB_00103f59;
    }
    in_RDX = CVar38.field_1;
    iVar15 = 0;
    paVar32 = paVar28;
LAB_00103f59:
    pbVar30 = pbVar31;
    if (iVar15 != 0) {
      if (iVar15 == 4) {
        local_4c = INTERPRET_RUNTIME_ERROR;
      }
      return local_4c;
    }
  } while( true );
}

Assistant:

static InterpretResult run(Vm *vm) {
    CallFrame *curr_frame = CURR_FRAME(vm);

    register uint8_t *ip = curr_frame->ip;
    register CrispyValue *sp = vm->sp;
    register uint8_t *code = curr_frame->code_buffer.code;

    CrispyValue *const_values = curr_frame->constants.values;
    ValueArray *variables = &curr_frame->variables;

#define READ_BYTE() (ip += 1, ip[-1])
#define READ_SHORT() (ip += 2, (uint16_t)((ip[-2] << 8) | ip[-1]))
#define READ_CONST() (const_values[READ_BYTE()])
#define READ_CONST_W() (ip += 2, const_values[(ip[-2] << 8) | ip[-1]])
#define READ_VAR() (variables->values[READ_BYTE()])
#define POP() (*(sp -= 1))
#define PUSH(value) (*sp = (value), sp += 1)
#define PEEK() (*(sp - 1))
#define BINARY_OP(op)                                           \
    do {                                                        \
        CrispyValue second = POP();                             \
        CrispyValue first = POP();                              \
        if (!CHECK_NUM(first) || !CHECK_NUM(second))            \
            goto ERROR;                                         \
        first.d_value = first.d_value op second.d_value;        \
        PUSH(first);                                            \
    } while (false)

#define COND_JUMP(op)                                           \
    do {                                                        \
        CrispyValue second = POP();                             \
        CrispyValue first = POP();                              \
        if (first.p_value op second.p_value) {                  \
            ip = code + READ_SHORT();                           \
        } else {                                                \
            READ_SHORT();                                       \
        }                                                       \
    } while(false)

    while (true) {
        OP_CODE instruction;

#if DEBUG_TRACE_EXECUTION
        {
            printf("-----\n");
            long stack_size = sp - vm->stack;
            for (int i = 0; i < stack_size; ++i) {
                printf("[%d] ", i);
                print_value(vm->stack[i], false, true);
                print_type(vm->stack[i]);
            }
            printf("sp: %li\n", stack_size);
            printf("ip: %li\n", ip - code);
            disassemble_instruction(vm, (int) (ip - code));
            printf("-----\n");
        }
#endif

#if DEBUG_TYPE_CHECK
        {
            long stack_size = sp - vm->stack;
            if (stack_size < 0) {
                printf("Negative stack pointer\n");
                goto ERROR;
            }
        }
#endif

        switch (instruction = (OP_CODE) READ_BYTE()) {
            case OP_RETURN:
                return INTERPRET_OK;
            case OP_LDC:
                PUSH(READ_CONST());
                break;
            case OP_LDC_W: {
                PUSH(READ_CONST_W());
                break;
            }
            case OP_LDC_0: {
                CrispyValue zero = create_number(0.0);
                PUSH(zero);
                break;
            }
            case OP_LDC_1: {
                CrispyValue one = create_number(1.0);
                PUSH(one);
                break;
            }
            case OP_CALL: {
                uint8_t num_args = READ_BYTE();
                CrispyValue *pos = (sp - num_args - 1);

                if (pos->type != OBJECT) {
                    fprintf(stderr, "Trying to call primitive CrispyValue\n");
                    goto ERROR;
                }

                Object *object = pos->o_value;
                object->marked = true;

                if (object->type == OBJ_NATIVE_FUNC) {
                    ObjNativeFunc *n_fn = (ObjNativeFunc *) object;
                    uint8_t expected = n_fn->num_params;

                    if (expected != num_args) {
                        fprintf(stderr, "Invalid number of arguments. Expected %d, but got %d\n", expected, num_args);
                        goto ERROR;
                    }

                    // Pop arguments from stack
                    CrispyValue args[num_args];
                    CrispyValue *start = sp - num_args;

                    for (int i = 0; i < num_args; ++i) {
                        args[i] = *(start++);
                        --sp;
                    }

                    CrispyValue res;
                    if (n_fn->system_func) {
                        vm->sp = sp;

                        // Disable garbage collection while executing native functions
                        vm->current_status = VM_STATUS_NO_GC;
                        res = ((CrispyValue (*)(CrispyValue *, Vm *vm)) n_fn->func_ptr)(args, vm);
                        vm->current_status = VM_STATUS_RUNNING;

                        if (vm->err_flag) {
                            vm->err_flag = false;
                            // the system native functions return the error message as a crispy string
                            print_value(res, true, false);
                            goto ERROR;
                        }

                    } else {
                        res = ((CrispyValue (*)(CrispyValue *)) n_fn->func_ptr)(args);
                    }

                    // pop
                    --sp;

                    PUSH(res);
                    break;
                }

                if (object->type != OBJ_LAMBDA) {
                    fprintf(stderr, "Trying to call non callable Object\n");
                    goto ERROR;
                }
                ObjLambda *lambda = ((ObjLambda *) object);

                uint8_t expected = lambda->num_params;
                if (expected != num_args) {
                    fprintf(stderr, "Invalid number of arguments. Expected %d, but got %d\n", expected, num_args);
                    goto ERROR;
                }

                // Pop arguments from stack
                CrispyValue args[num_args];
                for (int i = 0; i < num_args; ++i) {
                    args[i] = POP();
                }

                // Create a temp callframe with its own var array
                // otherwise recursion would override the variables of its predecessors on the callstack
                CallFrame *call_frame = new_temp_call_frame(lambda->call_frame);

                PUSH_FRAME(vm, call_frame);
                CrispyValue *before_sp = sp;

                for (int i = 0; i < num_args; ++i) {
                    PUSH(args[i]);
                }

                vm->sp = sp;
                InterpretResult result = run(vm);

                // free temp callframe
                temp_call_frame_free(POP_FRAME(vm));

                if (result != INTERPRET_OK) {
                    return result;
                }

                sp = before_sp;
                break;
            }
            case OP_ADD: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type == NUMBER && second.type == NUMBER) {
                    first.d_value += second.d_value;
                    PUSH(first);
                    break;
                }

                if (first.type == OBJECT) {
                    Object *first_obj = first.o_value;
                    first_obj->marked = true;

                    switch (first_obj->type) {
                        case OBJ_STRING: {
                            if (second.type != OBJECT || second.o_value->type != OBJ_STRING) {
                                fprintf(stderr,
                                        "Only strings can be appended to strings. Consider using the 'str' function\n");
                                goto ERROR;
                            }
                            ObjString *first_str = (ObjString *) first_obj;
                            ObjString *second_str = (ObjString *) second.o_value;
                            second_str->object.marked = true;

                            ObjString *dest = new_empty_string(vm, (first_str->length + second_str->length));

                            memcpy((char *) dest->start, first_str->start, first_str->length);
                            memcpy((char *) (dest->start + first_str->length), second_str->start, second_str->length);

                            PUSH(create_object((Object *) dest));
                            break;
                        }
                        case OBJ_LIST: {
                            ObjList *clone = clone_list(vm, (ObjList *) first_obj);
                            list_append(clone, second);

                            PUSH(create_object((Object *) clone));
                            break;
                        }
                        default:
                            fprintf(stderr, "Invalid target for addition\n");
                            goto ERROR;
                    }
                } else {
                    fprintf(stderr, "Invalid target for addition\n");
                    goto ERROR;
                }

                break;
            }
            case OP_SUB:
                BINARY_OP(-);
                break;
            case OP_MUL:
                BINARY_OP(*);
                break;
            case OP_MOD: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != NUMBER || second.type != NUMBER) {
                    fprintf(stderr, "Modulo operator (%%) only works on numbers\n");
                    goto ERROR;
                }

                int64_t first_int = (int64_t) first.d_value;
                int64_t second_int = (int64_t) second.d_value;

                PUSH(create_number(first_int % second_int));
                break;
            }
            case OP_DIV: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                if (!CHECK_NUM(first) || !CHECK_NUM(second)) {
                    goto ERROR;
                }

                if (second.d_value == 0) {
                    panic(vm, "Cannot divide by zero\n");
                }

                first.d_value = first.d_value / second.d_value;
                PUSH(first);
                break;
            }
            case OP_POW: {
                CrispyValue exponent = POP();
                CrispyValue base = POP();

                if (!CHECK_NUM(base) || !CHECK_NUM(exponent)) {
                    goto ERROR;
                }

                PUSH(create_number(pow(base.d_value, exponent.d_value)));

                break;
            }
            case OP_OR: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != BOOLEAN || second.type != BOOLEAN) {
                    goto ERROR;
                }

                PUSH(create_bool(first.p_value || second.p_value));

                break;
            }
            case OP_AND: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != BOOLEAN || second.type != BOOLEAN) {
                    goto ERROR;
                }

                PUSH(create_bool(first.p_value && second.p_value));

                break;
            }
            case OP_EQUAL: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) == 0));
                break;
            }
            case OP_NOT_EQUAL: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) != 0));
                break;
            }
            case OP_GE: {
                // TODO exception for non orderable type (e.g nil)
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) >= 0));
                break;
            }
            case OP_LE: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) <= 0));
                break;
            }
            case OP_GT: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) > 0));
                break;
            }
            case OP_LT: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) < 0));
                break;
            }
            case OP_NEGATE: {
                CrispyValue val = create_number(POP().d_value * -1);
                PUSH(val);
                break;
            }
            case OP_LOAD: {
                CrispyValue val = READ_VAR();
                PUSH(val);
                break;
            }
            case OP_LOAD_OFFSET: {
                uint8_t scope = READ_BYTE();
                uint8_t index = READ_BYTE();

                CallFrame *frame = FRAME_AT(vm, scope);
                CrispyValue val = frame->variables.values[index];

                PUSH(val);

                break;
            }
            case OP_STORE_OFFSET: {
                uint8_t scope = READ_BYTE();
                uint8_t index = READ_BYTE();

                CallFrame *frame = FRAME_AT(vm, scope);
                CrispyValue val = POP();

                frame->variables.values[index] = val;
                break;
            }
            case OP_STORE: {
                uint8_t index = READ_BYTE();
                CrispyValue val = POP();
                write_at(variables, index, val);
                break;
            }
            case OP_POP:
                --sp;
                break;
            case OP_DUP: {
                CrispyValue val = PEEK();
                PUSH(val);
                break;
            }
            case OP_JMP:
                ip = code + READ_SHORT();
                break;
            case OP_JMT: {
                CrispyValue value = POP();
                if (!CHECK_BOOL(value)) { goto ERROR; }
                if (BOOL_TRUE(value)) {
                    ip = code + READ_SHORT();
                } else {
                    ip += 2;
                }
                break;
            }
            case OP_JMF: {
                CrispyValue value = POP();
                if (!CHECK_BOOL(value)) { goto ERROR; }
                if (!BOOL_TRUE(value)) {
                    ip = code + READ_SHORT();
                } else {
                    ip += 2;
                }
                break;
            }
            case OP_JEQ:
                COND_JUMP(==);
                break;
            case OP_JNE:
                COND_JUMP(!=);
                break;
            case OP_JLT:
                COND_JUMP(<);
                break;
            case OP_JLE:
                COND_JUMP(<=);
                break;
            case OP_JGT:
                COND_JUMP(>);
                break;
            case OP_JGE:
                COND_JUMP(>=);
                break;
            case OP_INC_1: {
                uint8_t index = READ_BYTE();
                ++variables->values[index].d_value;
                break;
            }
            case OP_DEC_1: {
                uint8_t index = READ_BYTE();
                --variables->values[index].d_value;
                break;
            }
            case OP_NOT: {
                CrispyValue value = POP();

                if (value.type != BOOLEAN) {
                    goto ERROR;
                }

                value.p_value = value.p_value == 0 ? 1 : 0;
                PUSH(value);
                break;
            }
            case OP_TRUE:
                PUSH(create_bool(true));
                break;
            case OP_FALSE:
                PUSH(create_bool(false));
                break;
            case OP_NOP:
                PUSH(create_bool(false));
                break;
            case OP_NIL:
                PUSH(create_nil());
                break;
            case OP_PRINT: {
                CrispyValue value = POP();
                printf("> ");
                print_value(value, true, true);
                break;
            }
            case OP_DICT_NEW: {
                HashTable content;
                ht_init(&content, HT_KEY_OBJSTRING, 8, free_objstring);

                ObjDict *dict = new_dict(vm, content);
                CrispyValue value = create_object((Object *) dict);
                PUSH(value);
                break;
            }
            case OP_LIST_NEW: {
                ObjList *list = new_list(vm, 0);
                CrispyValue list_val = create_object((Object *) list);

                PUSH(list_val);
                break;
            }
            case OP_LIST_APPEND: {
                CrispyValue value = POP();
                CrispyValue list_val = PEEK();

                if (list_val.type != OBJECT || list_val.o_value->type != OBJ_LIST) {
                    fprintf(stderr, "Can only put values into lists\n");
                    goto ERROR;
                }

                ObjList *list = (ObjList *) list_val.o_value;

                list_append(list, value);
                break;
            }
            case OP_STRUCT_SET: {
                CrispyValue value = POP();
                CrispyValue key = POP();
                CrispyValue structure = PEEK();

                if (structure.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = structure.o_value;

                switch (obj->type) {
                    case OBJ_DICT: {
                        ObjDict *dict = (ObjDict *) obj;

                        if (key.type != OBJECT) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        HTItemKey ht_key;
                        Object *key_obj = key.o_value;

                        if (key_obj->type != OBJ_STRING) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        ht_key.key_obj_string = (ObjString *) key_obj;
                        ht_put(&dict->content, ht_key, value);
                        break;
                    }
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) obj;

                        // Check if key is an integer
                        if (key.type != NUMBER || floor(key.d_value) != key.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        int64_t index = (int64_t) key.d_value;
                        bool success = list_add(list, index, value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for set operation\n");
                        goto ERROR;
                }

                break;
            }
            case OP_STRUCT_GET: {
                CrispyValue key_val = POP();
                CrispyValue struct_val = POP();

                if (struct_val.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = struct_val.o_value;

                switch (obj->type) {
                    case OBJ_DICT: {
                        if (key_val.type != OBJECT) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }


                        ObjDict *dict = (ObjDict *) obj;
                        Object *key_obj = key_val.o_value;

                        if (key_obj->type != OBJ_STRING) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        ObjString *key_string = (ObjString *) key_obj;

                        HTItemKey key;
                        key.key_obj_string = key_string;

                        CrispyValue result = ht_get(&dict->content, key);
                        PUSH(result);
                        break;
                    }
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) obj;

                        // Check if key is an integer
                        if (key_val.type != NUMBER || floor(key_val.d_value) != key_val.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        int64_t index = (int64_t) key_val.d_value;
                        CrispyValue value;
                        bool success = list_get(list, index, &value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        PUSH(value);
                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for get operation\n");
                        goto ERROR;
                }

                break;
            }
            case OP_STRUCT_PEEK: {
                CrispyValue key_val = PEEK();
                CrispyValue struct_val = sp[-2];

                if (struct_val.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = struct_val.o_value;

                switch (obj->type) {
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) struct_val.o_value;

                        // Check if key is an integer
                        if (key_val.type != NUMBER || floor(key_val.d_value) != key_val.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        uint32_t index = (uint32_t) key_val.d_value;
                        CrispyValue value;
                        bool success = list_get(list, index, &value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        PUSH(value);
                        break;
                    }
                    case OBJ_DICT: {
                        ObjDict *dict = (ObjDict *) struct_val.o_value;
                        ObjString *key_string = (ObjString *) key_val.o_value;

                        HTItemKey key;
                        key.key_obj_string = key_string;

                        CrispyValue result = ht_get(&dict->content, key);
                        PUSH(result);
                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for get operation\n");
                        goto ERROR;
                }

                break;
            }
            default:
                printf("Unknown instruction %d\n", instruction);
                return INTERPRET_RUNTIME_ERROR;
        }
    }

    ERROR:
    return INTERPRET_RUNTIME_ERROR;

#undef COND_JUMP
#undef BINARY_OP
#undef PEEK
#undef PUSH
#undef POP
#undef READ_VAR
#undef READ_CONST
#undef READ_CONST_W
#undef READ_SHORT
#undef READ_BYTE
}